

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  SQObjectType SVar4;
  SQObjectPtr *pSVar5;
  long *plVar6;
  SQObjectValue SVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  SQObjectPtr local_30;
  
  SVar7.pNativeClosure = SQNativeClosure::Create(v->_sharedstate,func,nfreevars);
  ((SVar7.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  if (nfreevars != 0) {
    lVar9 = 8;
    do {
      pSVar8 = SQVM::Top(v);
      pSVar5 = (SVar7.pClosure)->_outervalues;
      uVar3 = *(uint *)((long)pSVar5 + lVar9 + -8);
      plVar6 = *(long **)((long)&(pSVar5->super_SQObject)._type + lVar9);
      *(SQObjectValue *)((long)&(pSVar5->super_SQObject)._type + lVar9) =
           (pSVar8->super_SQObject)._unVal;
      SVar4 = (pSVar8->super_SQObject)._type;
      *(SQObjectType *)((long)pSVar5 + lVar9 + -8) = SVar4;
      if ((SVar4 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(*(long *)((long)&(pSVar5->super_SQObject)._type + lVar9) + 8);
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = plVar6 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar6 + 0x10))();
        }
      }
      SQVM::Pop(v);
      lVar9 = lVar9 + 0x10;
      nfreevars = nfreevars - 1;
    } while (nfreevars != 0);
  }
  local_30.super_SQObject._type = OT_NATIVECLOSURE;
  local_30.super_SQObject._unVal.pNativeClosure = SVar7.pNativeClosure;
  if ((SQNativeClosure *)SVar7.pTable != (SQNativeClosure *)0x0) {
    pSVar2 = &((SVar7.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    SQVM::Push(v,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
    return;
  }
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                ,0xe7,"SQObjectPtr::SQObjectPtr(SQNativeClosure *)");
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}